

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# part_attr.c
# Opt level: O3

exr_result_t exr_get_name(exr_const_context_t_conflict ctxt,int part_index,char **out)

{
  exr_priv_part_t p_Var1;
  exr_result_t eVar2;
  exr_attribute_t *peVar3;
  exr_context_t nonc;
  
  if (ctxt == (exr_const_context_t_conflict)0x0) {
    eVar2 = 2;
  }
  else {
    if (ctxt->mode == '\x01') {
      pthread_mutex_lock((pthread_mutex_t *)&ctxt->mutex);
    }
    if ((part_index < 0) || (ctxt->num_parts <= part_index)) {
      if (ctxt->mode == '\x01') {
        pthread_mutex_unlock((pthread_mutex_t *)&ctxt->mutex);
      }
      eVar2 = (*ctxt->print_error)
                        (ctxt,4,"Part index (%d) out of range",(ulong)(uint)part_index,
                         ctxt->print_error);
      return eVar2;
    }
    if (out == (char **)0x0) {
      if (ctxt->mode == '\x01') {
        pthread_mutex_unlock((pthread_mutex_t *)&ctxt->mutex);
      }
      eVar2 = (*ctxt->print_error)(ctxt,3,"NULL output for \'name\'",ctxt->print_error);
      return eVar2;
    }
    p_Var1 = ctxt->parts[(uint)part_index];
    peVar3 = p_Var1->name;
    if (peVar3 == (exr_attribute_t *)0x0) {
      eVar2 = 0xf;
    }
    else {
      if (peVar3->type != EXR_ATTR_STRING) {
        if (ctxt->mode == '\x01') {
          pthread_mutex_unlock((pthread_mutex_t *)&ctxt->mutex);
          peVar3 = p_Var1->name;
        }
        eVar2 = (*ctxt->print_error)
                          (ctxt,6,"Invalid required attribute type \'%s\' for \'name\'",
                           peVar3->type_name,ctxt->print_error);
        return eVar2;
      }
      *out = (char *)((peVar3->field_6).box2i)->max;
      eVar2 = 0;
    }
    if (ctxt->mode == '\x01') {
      pthread_mutex_unlock((pthread_mutex_t *)&ctxt->mutex);
    }
  }
  return eVar2;
}

Assistant:

exr_result_t
exr_get_name (exr_const_context_t ctxt, int part_index, const char** out)
{
    EXR_LOCK_WRITE_AND_DEFINE_PART (part_index);
    if (!out)
        return EXR_UNLOCK_WRITE_AND_RETURN (ctxt->print_error (
            ctxt, EXR_ERR_INVALID_ARGUMENT, "NULL output for 'name'"));

    if (part->name)
    {
        if (part->name->type != EXR_ATTR_STRING)
            return EXR_UNLOCK_WRITE_AND_RETURN (ctxt->print_error (
                ctxt,
                EXR_ERR_FILE_BAD_HEADER,
                "Invalid required attribute type '%s' for 'name'",
                part->name->type_name));
        *out = part->name->string->str;
        return EXR_UNLOCK_WRITE_AND_RETURN (EXR_ERR_SUCCESS);
    }
    return EXR_UNLOCK_WRITE_AND_RETURN (EXR_ERR_NO_ATTR_BY_NAME);
}